

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O0

LY_ERR lyd_diff_attrs(lyd_node *first,lyd_node *second,uint16_t options,lyd_diff_op *op,
                     char **orig_default,char **orig_value)

{
  uint16_t uVar1;
  LY_ERR LVar2;
  char *pcVar3;
  char *local_70;
  lysc_node *local_60;
  LY_ERR ret__;
  char *str_val;
  lysc_node *schema;
  char **orig_value_local;
  char **orig_default_local;
  lyd_diff_op *op_local;
  uint16_t options_local;
  lyd_node *second_local;
  lyd_node *first_local;
  
  if ((first == (lyd_node *)0x0) && (second == (lyd_node *)0x0)) {
    __assert_fail("first || second",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                  0x2f7,
                  "LY_ERR lyd_diff_attrs(const struct lyd_node *, const struct lyd_node *, uint16_t, enum lyd_diff_op *, const char **, char **)"
                 );
  }
  *orig_default = (char *)0x0;
  *orig_value = (char *)0x0;
  if (first == (lyd_node *)0x0) {
    local_60 = second->schema;
  }
  else {
    local_60 = first->schema;
  }
  if (((local_60 != (lysc_node *)0x0) && ((local_60->nodetype & 0x18) != 0)) &&
     ((local_60->flags & 0x40) != 0)) {
    __assert_fail("!lysc_is_userordered(schema)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                  0x2fd,
                  "LY_ERR lyd_diff_attrs(const struct lyd_node *, const struct lyd_node *, uint16_t, enum lyd_diff_op *, const char **, char **)"
                 );
  }
  if (second == (lyd_node *)0x0) {
    *op = LYD_DIFF_OP_DELETE;
  }
  else if (first == (lyd_node *)0x0) {
    *op = LYD_DIFF_OP_CREATE;
  }
  else {
    uVar1 = local_60->nodetype;
    if (uVar1 == 1) {
      return LY_ENOT;
    }
    if (uVar1 != 4) {
      if ((uVar1 == 8) || (uVar1 == 0x10)) {
        if (((options & 1) == 0) || ((first->flags & 1) == (second->flags & 1))) {
          return LY_ENOT;
        }
        *op = LYD_DIFF_OP_NONE;
        goto LAB_00120921;
      }
      if ((uVar1 != 0x20) && (uVar1 != 0x60)) {
        if (uVar1 == 0x100) {
          return LY_ENOT;
        }
        if (uVar1 == 0x200) {
          return LY_ENOT;
        }
        if (uVar1 == 0x400) {
          return LY_ENOT;
        }
        ly_log(local_60->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",0x325
              );
        return LY_EINT;
      }
    }
    LVar2 = lyd_compare_single(first,second,0);
    if (LVar2 == LY_SUCCESS) {
      if (((options & 1) == 0) || ((first->flags & 1) == (second->flags & 1))) {
        return LY_ENOT;
      }
      *op = LYD_DIFF_OP_NONE;
    }
    else {
      *op = LYD_DIFF_OP_REPLACE;
    }
  }
LAB_00120921:
  if (((local_60->nodetype & 0xc) != 0) &&
     ((*op == LYD_DIFF_OP_REPLACE || (*op == LYD_DIFF_OP_NONE)))) {
    if ((first->flags & 1) == 0) {
      *orig_default = "false";
    }
    else {
      *orig_default = "true";
    }
  }
  if (((local_60->nodetype & 100) != 0) && (*op == LYD_DIFF_OP_REPLACE)) {
    if (local_60->nodetype == 4) {
      local_70 = lyd_get_value(first);
      if (local_70 == (char *)0x0) {
        local_70 = "";
      }
      pcVar3 = strdup(local_70);
      *orig_value = pcVar3;
      if (*orig_value == (char *)0x0) {
        ly_log(local_60->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lyd_diff_attrs");
        return LY_EMEM;
      }
    }
    else {
      LVar2 = lyd_any_value_str(first,orig_value);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
    }
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lyd_diff_attrs(const struct lyd_node *first, const struct lyd_node *second, uint16_t options, enum lyd_diff_op *op,
        const char **orig_default, char **orig_value)
{
    const struct lysc_node *schema;
    const char *str_val;

    assert(first || second);

    *orig_default = NULL;
    *orig_value = NULL;

    schema = first ? first->schema : second->schema;
    assert(!lysc_is_userordered(schema));

    /* learn operation first */
    if (!second) {
        *op = LYD_DIFF_OP_DELETE;
    } else if (!first) {
        *op = LYD_DIFF_OP_CREATE;
    } else {
        switch (schema->nodetype) {
        case LYS_CONTAINER:
        case LYS_RPC:
        case LYS_ACTION:
        case LYS_NOTIF:
            /* no changes */
            return LY_ENOT;
        case LYS_LIST:
        case LYS_LEAFLIST:
            if ((options & LYD_DIFF_DEFAULTS) && ((first->flags & LYD_DEFAULT) != (second->flags & LYD_DEFAULT))) {
                /* default flag change */
                *op = LYD_DIFF_OP_NONE;
            } else {
                /* no changes */
                return LY_ENOT;
            }
            break;
        case LYS_LEAF:
        case LYS_ANYXML:
        case LYS_ANYDATA:
            if (lyd_compare_single(first, second, 0)) {
                /* different values */
                *op = LYD_DIFF_OP_REPLACE;
            } else if ((options & LYD_DIFF_DEFAULTS) && ((first->flags & LYD_DEFAULT) != (second->flags & LYD_DEFAULT))) {
                /* default flag change */
                *op = LYD_DIFF_OP_NONE;
            } else {
                /* no changes */
                return LY_ENOT;
            }
            break;
        default:
            LOGINT_RET(schema->module->ctx);
        }
    }

    /*
     * set each attribute correctly based on the operation and node type
     */

    /* orig-default */
    if ((schema->nodetype & LYD_NODE_TERM) && ((*op == LYD_DIFF_OP_REPLACE) || (*op == LYD_DIFF_OP_NONE))) {
        if (first->flags & LYD_DEFAULT) {
            *orig_default = "true";
        } else {
            *orig_default = "false";
        }
    }

    /* orig-value */
    if ((schema->nodetype & (LYS_LEAF | LYS_ANYDATA)) && (*op == LYD_DIFF_OP_REPLACE)) {
        if (schema->nodetype == LYS_LEAF) {
            str_val = lyd_get_value(first);
            *orig_value = strdup(str_val ? str_val : "");
            LY_CHECK_ERR_RET(!*orig_value, LOGMEM(schema->module->ctx), LY_EMEM);
        } else {
            LY_CHECK_RET(lyd_any_value_str(first, orig_value));
        }
    }

    return LY_SUCCESS;
}